

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O2

void __thiscall
fill<128U,_22U,_buffer_layout_bfs>::operator()
          (fill<128U,_22U,_buffer_layout_bfs> *this,array<Stream,_128UL> *streams,uchar **buffer,
          array<unsigned_long,_128UL> *buffer_count)

{
  unsigned_long *puVar1;
  unsigned_long *puVar2;
  uchar **ppuVar3;
  uchar *puVar4;
  uchar **ppuVar5;
  int iVar6;
  ostream *poVar7;
  unsigned_long *puVar8;
  unsigned_long uVar9;
  unsigned_long uVar10;
  size_t n0;
  long lVar11;
  size_t sVar12;
  fill<128U,_44U,_buffer_layout_bfs> local_5c;
  fill<128U,_45U,_buffer_layout_bfs> local_5b;
  fill<128U,_45U,_buffer_layout_bfs> local_5a;
  fill<128U,_44U,_buffer_layout_bfs> local_59;
  uchar **local_58;
  array<Stream,_128UL> *local_50;
  DI __d;
  
  local_50 = streams;
  poVar7 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  poVar7 = std::operator<<(poVar7,"fill_inner");
  poVar7 = std::operator<<(poVar7,", inner, I=");
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::operator<<(poVar7,"\n");
  __d.i = &__debug_indent_str_abi_cxx11_;
  std::__cxx11::string::append((char *)&__debug_indent_str_abi_cxx11_);
  puVar1 = buffer_count->_M_elems + 0x2c;
  puVar2 = buffer_count->_M_elems + 0x2d;
  local_58 = buffer + 0x2406;
  n0 = 0;
  lVar11 = 0;
  do {
    uVar9 = *puVar1;
    if (uVar9 == 0) {
      fill<128U,_44U,_buffer_layout_bfs>::operator()(&local_59,local_50,buffer,buffer_count);
      uVar9 = *puVar1;
      if (uVar9 == 0) {
        poVar7 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
        std::operator<<(poVar7,"left stream drained\n");
        sVar12 = -lVar11;
        lVar11 = -n0;
        uVar9 = *puVar2;
        goto LAB_0016af96;
      }
    }
    uVar10 = *puVar2;
    if (uVar10 == 0) {
      fill<128U,_45U,_buffer_layout_bfs>::operator()(&local_5a,local_50,buffer,buffer_count);
      uVar10 = *puVar2;
      if (uVar10 == 0) {
        poVar7 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
        std::operator<<(poVar7,"right stream drained\n");
        sVar12 = -lVar11;
        lVar11 = -n0;
        uVar9 = *puVar1;
        goto LAB_0016b067;
      }
      uVar9 = *puVar1;
    }
    poVar7 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
    poVar7 = std::operator<<(poVar7,"L:\'");
    ppuVar3 = buffer + (0x5d08 - uVar9);
    poVar7 = std::operator<<(poVar7,(char *)*ppuVar3);
    poVar7 = std::operator<<(poVar7,"\', R:\'");
    ppuVar5 = buffer + (0x5d10 - uVar10);
    poVar7 = std::operator<<(poVar7,(char *)*ppuVar5);
    std::operator<<(poVar7,"\'\n");
    iVar6 = cmp(*ppuVar3,*ppuVar5);
    puVar8 = puVar2;
    if (iVar6 < 1) {
      puVar8 = puVar1;
      ppuVar5 = ppuVar3;
    }
    puVar4 = *ppuVar5;
    *puVar8 = *puVar8 - 1;
    buffer[n0 + 0x2406] = puVar4;
    check_input(local_58,n0);
    lVar11 = lVar11 + -8;
    n0 = n0 + 1;
  } while (n0 != 0x5a9);
  poVar7 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  std::operator<<(poVar7,"Done, buffer filled\n");
  buffer_count->_M_elems[0x16] = 0x5a9;
  goto LAB_0016b1ce;
LAB_0016af96:
  do {
    if (uVar9 == 0) {
      fill<128U,_45U,_buffer_layout_bfs>::operator()(&local_5b,local_50,buffer,buffer_count);
      uVar9 = *puVar2;
      if (uVar9 == 0) {
        poVar7 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
        std::operator<<(poVar7,"both streams prematurely drained\n");
        memmove(buffer + lVar11 + 0x29af,local_58,sVar12);
        buffer_count->_M_elems[0x16] = -lVar11;
        check_input((uchar **)((long)buffer + (0x14d78 - sVar12)),-lVar11);
        goto LAB_0016b1ce;
      }
    }
    *(uchar **)((long)buffer + sVar12 + 0x12030) = buffer[0x5d10 - uVar9];
    uVar9 = uVar9 - 1;
    *puVar2 = uVar9;
    lVar11 = lVar11 + -1;
    sVar12 = sVar12 + 8;
  } while (sVar12 != 0x2d48);
  poVar7 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  std::operator<<(poVar7,"\tbuffer filled\n");
  buffer_count->_M_elems[0x16] = 0x5a9;
  check_input(local_58,0x5a9);
  goto LAB_0016b1ce;
LAB_0016b067:
  do {
    if (uVar9 == 0) {
      fill<128U,_44U,_buffer_layout_bfs>::operator()(&local_5c,local_50,buffer,buffer_count);
      uVar9 = *puVar1;
      if (uVar9 == 0) {
        poVar7 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
        std::operator<<(poVar7,"both streams prematurely drained\n");
        memmove(buffer + lVar11 + 0x29af,local_58,sVar12);
        buffer_count->_M_elems[0x16] = -lVar11;
        check_input((uchar **)((long)buffer + (0x14d78 - sVar12)),-lVar11);
        goto LAB_0016b1ce;
      }
    }
    *(uchar **)((long)buffer + sVar12 + 0x12030) = buffer[0x5d08 - uVar9];
    uVar9 = uVar9 - 1;
    *puVar1 = uVar9;
    lVar11 = lVar11 + -1;
    sVar12 = sVar12 + 8;
  } while (sVar12 != 0x2d48);
  poVar7 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  std::operator<<(poVar7,"buffer filled\n");
  buffer_count->_M_elems[0x16] = 0x5a9;
  check_input(local_58,0x5a9);
LAB_0016b1ce:
  anon_func::DI::~DI(&__d);
  return;
}

Assistant:

void operator()(std::array<Stream,K>& restrict streams,
	                unsigned char** restrict buffer,
	                std::array<size_t,K>& restrict buffer_count) const
	{
		fill_inner<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>1 && I<K/2)>());
		fill_leaf<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>=K/2 && I<K)>());
	}